

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O2

void __thiscall Game::setTeams(Game *this)

{
  Team *this_00;
  Team *this_01;
  allocator local_59;
  string local_58;
  string local_38;
  
  this_00 = (Team *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_38,"Team 1",&local_59);
  Team::Team(this_00,&local_38,(this->_players)._M_elems[0],(this->_players)._M_elems[2]);
  std::__cxx11::string::~string((string *)&local_38);
  this_01 = (Team *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_58,"Team 2",&local_59);
  Team::Team(this_01,&local_58,(this->_players)._M_elems[1],(this->_players)._M_elems[3]);
  std::__cxx11::string::~string((string *)&local_58);
  (this->_teams)._M_elems[0] = this_00;
  (this->_teams)._M_elems[1] = this_01;
  return;
}

Assistant:

void Game::setTeams() {
    Team *team1 = new Team("Team 1", _players[0], _players[2]);
    Team *team2 = new Team("Team 2", _players[1], _players[3]);
    _teams = {team1, team2};
}